

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O0

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>> *this,
          VectorBlock<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1> *essential
          ,Scalar *tau,Scalar *workspace)

{
  Index IVar1;
  Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *xpr;
  Index blockCols;
  Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false> *local_440
  ;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
  local_438;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_3b0;
  RowXpr local_308;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>_>
  local_2a0;
  RowXpr local_258;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_> *local_1f0;
  AdjointReturnType local_1e8;
  Product<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
  local_188;
  undefined1 local_c0 [8];
  Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false> bottom;
  undefined1 local_50 [8];
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_> tmp;
  Scalar *workspace_local;
  Scalar *tau_local;
  VectorBlock<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1> *essential_local;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_> *this_local;
  
  IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>::rows
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_>
                      *)this);
  if (IVar1 == 1) {
    tmp._24_8_ = 1.0 - *tau;
    DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_> *)this
               ,(Scalar *)&tmp.m_stride);
  }
  else if ((*tau != 0.0) || (NAN(*tau))) {
    IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>::cols
                      ((EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_>
                        *)this);
    Stride<0,_0>::Stride
              ((Stride<0,_0> *)
               ((long)&bottom.
                       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                       .m_outerStride + 6));
    Map<Eigen::Matrix<double,_1,_-1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>::Map
              ((Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_> *)local_50,
               workspace,IVar1,
               (Stride<0,_0> *)
               ((long)&bottom.
                       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                       .m_outerStride + 6));
    xpr = EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>::derived
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_>
                      *)this);
    IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>::rows
                      ((EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_>
                        *)this);
    blockCols = EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>::cols
                          ((EigenBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_>
                            *)this);
    Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_-1,_-1,_false>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>
                *)local_c0,xpr,1,0,IVar1 + -1,blockCols);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>
    ::adjoint(&local_1e8,
              (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
               *)essential);
    MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,-1,1,false>const>>
    ::operator*(&local_188,
                (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const>>
                 *)&local_1e8,
                (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>_>
                 *)local_c0);
    local_1f0 = (Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_> *)
                MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>_>
                ::noalias((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>_>
                           *)local_50);
    NoAlias<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,3>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,3>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
               *)&local_1f0,
              (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>_>
               *)&local_188);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>::row
              (&local_258,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_> *)this
               ,0);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,3>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,3>,0,Eigen::Stride<0,0>>> *)
               local_50,(MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1,__1,_false>_>
                         *)&local_258);
    Eigen::operator*(&local_2a0,tau,(StorageBaseType *)local_50);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>::row
              (&local_308,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_> *)this
               ,0);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>,1,-1,false>>::
    operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,1,_1,false>>
                *)&local_308,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_2a0);
    Eigen::operator*(&local_438,tau,(StorageBaseType *)essential);
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,3,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,-1,1,false>const>>
    ::operator*(&local_3b0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const>>
                 *)&local_438,
                (MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>_>
                 *)local_50);
    local_440 = (Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>
                 *)MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_-1,_-1,_false>_>
                   ::noalias((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>_>
                              *)local_c0);
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>,-1,-1,false>,Eigen::MatrixBase>
    ::operator-=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,_1,_1,false>,Eigen::MatrixBase>
                  *)&local_440,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                  *)&local_3b0);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else if(tau!=Scalar(0))
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}